

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

adj_list *
get_adj(adj_list *__return_storage_ptr__,int nv,vector<Arc,_std::allocator<Arc>_> *arcs,
       bool transpose)

{
  int iVar1;
  pointer pAVar2;
  pointer pvVar3;
  runtime_error *this;
  pointer pAVar4;
  char _error_msg_ [256];
  
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(__return_storage_ptr__,(long)nv,(allocator_type *)_error_msg_);
  pAVar4 = (arcs->super__Vector_base<Arc,_std::allocator<Arc>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pAVar2 = (arcs->super__Vector_base<Arc,_std::allocator<Arc>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  while( true ) {
    if (pAVar4 == pAVar2) {
      return __return_storage_ptr__;
    }
    iVar1 = pAVar4->u;
    if ((nv <= iVar1) || (nv <= pAVar4->v)) break;
    pvVar3 = (__return_storage_ptr__->
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (transpose) {
      _error_msg_._4_4_ = pAVar4->label;
      _error_msg_._0_4_ = iVar1;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 (pvVar3 + pAVar4->v),(pair<int,_int> *)_error_msg_);
    }
    else {
      _error_msg_._0_8_ = *(undefined8 *)&pAVar4->v;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)(pvVar3 + iVar1),
                 (pair<int,_int> *)_error_msg_);
    }
    pAVar4 = pAVar4 + 1;
  }
  snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "a.u < nv && a.v < nv",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/graph.cpp",
           0x49);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,_error_msg_);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

adj_list get_adj(int nv, const std::vector<Arc> &arcs, bool transpose) {
	adj_list adj(nv);
	for (const Arc &a : arcs) {
		throw_assert(a.u < nv && a.v < nv);
		if (!transpose) {
			adj[a.u].push_back(MP(a.v, a.label));
		} else {
			adj[a.v].push_back(MP(a.u, a.label));
		}
	}
	return adj;
}